

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O2

int spng_set_splt(spng_ctx *ctx,spng_splt *splt,uint32_t n_splt)

{
  undefined1 *puVar1;
  void *pvVar2;
  int iVar3;
  spng_chunk_bitfield sVar4;
  ulong uVar5;
  long lVar6;
  
  iVar3 = 1;
  if ((n_splt != 0) && (splt != (spng_splt *)0x0 && ctx != (spng_ctx *)0x0)) {
    if ((ctx->data == (uchar *)0x0) && ((ctx->field_0xcc & 0x10) == 0)) {
      iVar3 = 0x52;
    }
    else {
      iVar3 = read_chunks(ctx,0);
      if (iVar3 == 0) {
        for (lVar6 = 0; (ulong)n_splt * 0x60 - lVar6 != 0; lVar6 = lVar6 + 0x60) {
          iVar3 = check_png_keyword(splt->name + lVar6);
          if (iVar3 != 0) {
            return 0x38;
          }
          if ((splt->name[lVar6 + 0x50] != '\x10') && (splt->name[lVar6 + 0x50] != '\b')) {
            return 0x3a;
          }
        }
        sVar4 = ctx->stored;
        if ((((uint)sVar4 >> 0xc & 1) != 0) && (((ctx->user).field_0x1 & 0x10) == 0)) {
          lVar6 = 0x58;
          for (uVar5 = 0; uVar5 < ctx->n_splt; uVar5 = uVar5 + 1) {
            pvVar2 = *(void **)(ctx->splt_list->name + lVar6);
            if (pvVar2 != (void *)0x0) {
              (*(ctx->alloc).free_fn)(pvVar2);
            }
            lVar6 = lVar6 + 0x60;
          }
          (*(ctx->alloc).free_fn)(ctx->splt_list);
          sVar4 = ctx->stored;
        }
        ctx->splt_list = splt;
        ctx->n_splt = n_splt;
        ctx->stored = (spng_chunk_bitfield)((uint)sVar4 | 0x1000);
        puVar1 = &(ctx->user).field_0x1;
        *puVar1 = *puVar1 | 0x10;
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int spng_set_splt(spng_ctx *ctx, struct spng_splt *splt, uint32_t n_splt)
{
    if(!n_splt) return 1;
    SPNG_SET_CHUNK_BOILERPLATE(splt);

    uint32_t i;
    for(i=0; i < n_splt; i++)
    {
        if(check_png_keyword(splt[i].name)) return SPNG_ESPLT_NAME;
        if( !(splt[i].sample_depth == 8 || splt[i].sample_depth == 16) ) return SPNG_ESPLT_DEPTH;
    }

    if(ctx->stored.splt && !ctx->user.splt)
    {
        for(i=0; i < ctx->n_splt; i++)
        {
            if(ctx->splt_list[i].entries != NULL) spng__free(ctx, ctx->splt_list[i].entries);
        }
        spng__free(ctx, ctx->splt_list);
    }

    ctx->splt_list = splt;
    ctx->n_splt = n_splt;

    ctx->stored.splt = 1;
    ctx->user.splt = 1;

    return 0;
}